

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfuda_cache.hpp
# Opt level: O2

size_t __thiscall
cappuccino::
lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_dynamic_age(lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                 *this,time_point now)

{
  _List_node_base *p_Var1;
  iterator iVar2;
  int __fdin;
  __off64_t *in_R8;
  size_t in_R9;
  _List_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  _Var3;
  size_t sVar4;
  float fVar5;
  iterator da_start;
  size_t use_count;
  uint in_stack_ffffffffffffffb8;
  _List_iterator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  local_40;
  ulong local_38;
  
  _Var3._M_node =
       (this->m_dynamic_age_list).
       super__List_base<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  p_Var1 = (this->m_open_list_end)._M_node;
  sVar4 = 0;
  local_40._M_node = p_Var1;
  while ((_Var3._M_node != p_Var1 &&
         ((long)(_Var3._M_node[2]._M_next + (this->m_dynamic_age_tick).__r * 0xf424) <
          (long)now.__d.__r))) {
    if (_Var3._M_node != local_40._M_node) {
      __fdin = (int)local_40._M_node;
      local_40._M_node = _Var3._M_node;
      std::__cxx11::
      list<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
      ::splice(&this->m_dynamic_age_list,__fdin,(__off64_t *)&this->m_dynamic_age_list,
               (int)_Var3._M_node,in_R8,in_R9,in_stack_ffffffffffffffb8);
      _Var3._M_node = local_40._M_node;
    }
    local_40._M_node = _Var3._M_node;
    _Var3._M_node = local_40._M_node;
    local_40._M_node[2]._M_next = (_List_node_base *)now.__d.__r;
    local_38 = *(ulong *)((_Base_ptr)local_40._M_node[1]._M_prev + 1);
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                        *)&this->m_lfu_list,(_Base_ptr)local_40._M_node[1]._M_prev);
    fVar5 = (float)local_38 * this->m_dynamic_age_ratio;
    local_38 = (ulong)fVar5;
    local_38 = (long)(fVar5 - 9.223372e+18) & (long)local_38 >> 0x3f | local_38;
    iVar2 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
            ::
            _M_emplace_equal<unsigned_long&,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::_Select1st<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::lfuda_cache<std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>>
                        *)&this->m_lfu_list,&local_38,&local_40);
    _Var3._M_node[1]._M_prev = (_List_node_base *)iVar2._M_node;
    _Var3._M_node =
         (this->m_dynamic_age_list).
         super__List_base<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::lfuda_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    sVar4 = sVar4 + 1;
    p_Var1 = (this->m_open_list_end)._M_node;
  }
  return sVar4;
}

Assistant:

auto do_dynamic_age(std::chrono::steady_clock::time_point now) -> size_t
    {
        size_t aged{0};

        // For all items in the DA list that are old enough and in use, DA them!
        auto da_start = m_dynamic_age_list.begin();
        auto da_last  = m_open_list_end; // need the item previous to the end to splice properly
        while (da_start != m_open_list_end && (*da_start).m_dynamic_age + m_dynamic_age_tick < now)
        {
            // swap to after the last item (if it isn't the last item..)
            if (da_start != da_last)
            {
                m_dynamic_age_list.splice(da_last, m_dynamic_age_list, da_start);
            }

            // Update its dynamic age time to now.
            element& e      = *da_start;
            e.m_dynamic_age = now;
            // Now *= ratio its use count to actually age it.  This requires
            // deleting from and re-inserting into the lfu data structure.
            size_t use_count = e.m_lfu_position->first;
            m_lfu_list.erase(e.m_lfu_position);
            use_count        = (size_t)(use_count * m_dynamic_age_ratio);
            e.m_lfu_position = m_lfu_list.emplace(use_count, da_start);

            // The last item is now this item!  This will maintain the insertion order.
            da_last = da_start;

            // Keep pruning from the beginning until we are m_open_list_end or not aged enough.
            da_start = m_dynamic_age_list.begin();
            ++aged;
        }

        return aged;
    }